

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O0

void __thiscall
dynet::NaryTreeLSTMBuilder::NaryTreeLSTMBuilder
          (NaryTreeLSTMBuilder *this,uint N,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  initializer_list<dynet::Parameter> __l;
  initializer_list<dynet::LookupParameter> __l_00;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  LookupParameter __a;
  Parameter this_00;
  undefined4 in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  string *in_RDI;
  string *init;
  Dim *this_01;
  ParameterCollection *this_02;
  undefined4 in_R8D;
  size_type in_R9;
  vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_> lps;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  Parameter p_bc;
  LookupParameter p_h2c;
  Parameter p_x2c;
  Parameter p_bo;
  LookupParameter p_c2o;
  LookupParameter p_h2o;
  Parameter p_x2o;
  Parameter p_bf;
  LookupParameter p_c2f;
  LookupParameter p_h2f;
  Parameter p_x2f;
  Parameter p_bi;
  LookupParameter p_c2i;
  LookupParameter p_h2i;
  Parameter p_x2i;
  uint i;
  uint layer_input_dim;
  undefined4 in_stack_fffffffffffff548;
  float in_stack_fffffffffffff54c;
  ParameterCollection *in_stack_fffffffffffff550;
  value_type *__x;
  allocator *this_03;
  Device *in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  Parameter in_stack_fffffffffffff598;
  allocator *in_stack_fffffffffffff5a0;
  uint n;
  ParameterCollection *in_stack_fffffffffffff5a8;
  Parameter in_stack_fffffffffffff5b0;
  allocator *in_stack_fffffffffffff5b8;
  float scale;
  Dim *in_stack_fffffffffffff5c0;
  LookupParameter in_stack_fffffffffffff5c8;
  Device *device;
  Dim *in_stack_fffffffffffff760;
  LookupParameterStorage *in_stack_fffffffffffff768;
  undefined1 local_831 [25];
  ParameterStorage *local_818;
  ParameterStorage *local_810;
  ParameterStorage *local_808;
  ParameterStorage *local_800;
  ParameterStorage *local_7f8;
  undefined1 *local_7f0;
  undefined8 local_7e8;
  allocator local_7c1;
  string local_7c0 [52];
  undefined4 local_78c;
  undefined4 *local_788;
  undefined8 local_780;
  ParameterStorage *local_750;
  allocator local_741;
  string local_740 [32];
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 *local_718;
  undefined8 local_710;
  LookupParameterStorage *local_6e0;
  allocator local_6d1;
  string local_6d0 [32];
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 *local_6a8;
  undefined8 local_6a0;
  ParameterStorage *local_670;
  allocator local_661;
  string local_660 [52];
  undefined4 local_62c;
  undefined4 *local_628;
  undefined8 local_620;
  ParameterStorage *local_5f0;
  allocator local_5e1;
  string local_5e0 [32];
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 *local_5b8;
  undefined8 local_5b0;
  LookupParameterStorage *local_580;
  allocator local_571;
  string local_570 [32];
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 *local_548;
  undefined8 local_540;
  LookupParameterStorage *local_510;
  allocator local_501;
  string local_500 [32];
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 *local_4d8;
  undefined8 local_4d0;
  ParameterStorage *local_4a0;
  allocator local_491;
  string local_490 [52];
  undefined4 local_45c;
  undefined4 *local_458;
  undefined8 local_450;
  ParameterStorage *local_420;
  allocator local_411;
  string local_410 [32];
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 *local_3e8;
  undefined8 local_3e0;
  LookupParameterStorage *local_3b0;
  allocator local_3a1;
  string local_3a0 [32];
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 *local_378;
  undefined8 local_370;
  LookupParameterStorage *local_340;
  allocator local_331;
  string local_330 [32];
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 *local_308;
  undefined8 local_300;
  ParameterStorage *local_2d0;
  allocator local_2c1;
  string local_2c0 [52];
  undefined4 local_28c;
  undefined4 *local_288;
  undefined8 local_280;
  ParameterStorage *local_250;
  allocator local_241;
  string local_240 [32];
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 *local_218;
  undefined8 local_210;
  LookupParameterStorage *local_1e0;
  allocator local_1d1;
  string local_1d0 [32];
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 *local_1a8;
  undefined8 local_1a0;
  LookupParameterStorage *local_170;
  allocator local_161;
  string local_160 [32];
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 *local_138;
  undefined8 local_130;
  ParameterStorage *local_100;
  uint local_f8;
  undefined1 local_f1 [193];
  undefined4 local_30;
  size_type local_20;
  undefined4 local_18;
  undefined4 local_14;
  uint local_10;
  undefined4 local_c;
  
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  TreeLSTMBuilder::TreeLSTMBuilder((TreeLSTMBuilder *)in_stack_fffffffffffff550);
  *(undefined ***)in_RDI = &PTR__NaryTreeLSTMBuilder_010494f0;
  init = in_RDI + 0x30;
  ParameterCollection::ParameterCollection
            ((ParameterCollection *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  std::
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ::vector((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            *)0xdc080e);
  std::
  vector<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
  ::vector((vector<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
            *)0xdc082a);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0xdc0846);
  std::
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
            *)0xdc0862);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0xdc087e);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::vector((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
            *)0xdc089a);
  this_01 = (Dim *)(in_RDI + 0x168);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc08b6);
  this_02 = (ParameterCollection *)(in_RDI + 0x180);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc08d2);
  *(uint *)(in_RDI + 0x198) = local_10;
  *(undefined4 *)(in_RDI + 0x19c) = local_c;
  *(undefined8 *)(in_RDI + 0x1a0) = 0;
  local_30 = local_14;
  device = (Device *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_f1 + 1),"nary-tree-lstm-builder",(allocator *)device);
  ParameterCollection::add_subcollection(this_02,(string *)this_01);
  ParameterCollection::operator=
            (in_stack_fffffffffffff550,
             (ParameterCollection *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  ParameterCollection::~ParameterCollection(in_stack_fffffffffffff550);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  for (local_f8 = 0; n = (uint)((ulong)in_stack_fffffffffffff5a0 >> 0x20),
      scale = (float)((ulong)in_stack_fffffffffffff5b8 >> 0x20), local_f8 < local_10;
      local_f8 = local_f8 + 1) {
    local_140 = local_18;
    local_13c = local_30;
    local_138 = &local_140;
    local_130 = 2;
    x._M_len = local_20;
    x._M_array = (iterator)this_02;
    Dim::Dim(this_01,x);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"",&local_161);
    local_100 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          ((ParameterCollection *)in_stack_fffffffffffff5c8.p,
                           in_stack_fffffffffffff5c0,scale,in_stack_fffffffffffff5b0.p,
                           (Device *)in_stack_fffffffffffff5a8);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    local_1b0 = local_18;
    local_1ac = local_18;
    local_1a8 = &local_1b0;
    local_1a0 = 2;
    x_00._M_len = local_20;
    x_00._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"",&local_1d1);
    local_170 = (LookupParameterStorage *)
                ParameterCollection::add_lookup_parameters
                          (in_stack_fffffffffffff5a8,n,(Dim *)in_stack_fffffffffffff598.p,
                           (string *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                           in_stack_fffffffffffff588);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    local_220 = local_18;
    local_21c = local_18;
    local_218 = &local_220;
    local_210 = 2;
    x_01._M_len = local_20;
    x_01._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"",&local_241);
    local_1e0 = (LookupParameterStorage *)
                ParameterCollection::add_lookup_parameters
                          (in_stack_fffffffffffff5a8,n,(Dim *)in_stack_fffffffffffff598.p,
                           (string *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                           in_stack_fffffffffffff588);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    local_28c = local_18;
    local_288 = &local_28c;
    local_280 = 1;
    x_02._M_len = local_20;
    x_02._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_02);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff550,in_stack_fffffffffffff54c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"",&local_2c1);
    local_250 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          ((ParameterCollection *)in_stack_fffffffffffff768,
                           in_stack_fffffffffffff760,(ParameterInit *)init,in_RDI,device);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0xdc0dfa);
    local_310 = local_18;
    local_30c = local_30;
    local_308 = &local_310;
    local_300 = 2;
    x_03._M_len = local_20;
    x_03._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_03);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"",&local_331);
    local_2d0 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          ((ParameterCollection *)in_stack_fffffffffffff5c8.p,
                           in_stack_fffffffffffff5c0,scale,in_stack_fffffffffffff5b0.p,
                           (Device *)in_stack_fffffffffffff5a8);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    local_380 = local_18;
    local_37c = local_18;
    local_378 = &local_380;
    local_370 = 2;
    x_04._M_len = local_20;
    x_04._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_04);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a0,"",&local_3a1);
    local_340 = (LookupParameterStorage *)
                ParameterCollection::add_lookup_parameters
                          (in_stack_fffffffffffff5a8,n,(Dim *)in_stack_fffffffffffff598.p,
                           (string *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                           in_stack_fffffffffffff588);
    std::__cxx11::string::~string(local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    local_3f0 = local_18;
    local_3ec = local_18;
    local_3e8 = &local_3f0;
    local_3e0 = 2;
    x_05._M_len = local_20;
    x_05._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_05);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_410,"",&local_411);
    local_3b0 = (LookupParameterStorage *)
                ParameterCollection::add_lookup_parameters
                          (in_stack_fffffffffffff5a8,n,(Dim *)in_stack_fffffffffffff598.p,
                           (string *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                           in_stack_fffffffffffff588);
    std::__cxx11::string::~string(local_410);
    std::allocator<char>::~allocator((allocator<char> *)&local_411);
    local_45c = local_18;
    local_458 = &local_45c;
    local_450 = 1;
    x_06._M_len = local_20;
    x_06._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_06);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff550,in_stack_fffffffffffff54c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,"",&local_491);
    local_420 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          ((ParameterCollection *)in_stack_fffffffffffff768,
                           in_stack_fffffffffffff760,(ParameterInit *)init,in_RDI,device);
    std::__cxx11::string::~string(local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0xdc122a);
    local_4e0 = local_18;
    local_4dc = local_30;
    local_4d8 = &local_4e0;
    local_4d0 = 2;
    x_07._M_len = local_20;
    x_07._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_07);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_500,"",&local_501);
    local_4a0 = (ParameterStorage *)
                ParameterCollection::add_parameters
                          ((ParameterCollection *)in_stack_fffffffffffff5c8.p,
                           in_stack_fffffffffffff5c0,scale,in_stack_fffffffffffff5b0.p,
                           (Device *)in_stack_fffffffffffff5a8);
    std::__cxx11::string::~string(local_500);
    std::allocator<char>::~allocator((allocator<char> *)&local_501);
    local_550 = local_18;
    local_54c = local_18;
    local_548 = &local_550;
    local_540 = 2;
    x_08._M_len = local_20;
    x_08._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_570,"",&local_571);
    local_510 = (LookupParameterStorage *)
                ParameterCollection::add_lookup_parameters
                          (in_stack_fffffffffffff5a8,n,(Dim *)in_stack_fffffffffffff598.p,
                           (string *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                           in_stack_fffffffffffff588);
    std::__cxx11::string::~string(local_570);
    std::allocator<char>::~allocator((allocator<char> *)&local_571);
    local_5c0 = local_18;
    local_5bc = local_18;
    local_5b8 = &local_5c0;
    local_5b0 = 2;
    x_09._M_len = local_20;
    x_09._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e0,"",&local_5e1);
    in_stack_fffffffffffff5c8 =
         ParameterCollection::add_lookup_parameters
                   (in_stack_fffffffffffff5a8,n,(Dim *)in_stack_fffffffffffff598.p,
                    (string *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                    in_stack_fffffffffffff588);
    local_580 = in_stack_fffffffffffff5c8.p;
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    in_stack_fffffffffffff5c0 = (Dim *)(in_RDI + 0x30);
    local_62c = local_18;
    local_628 = &local_62c;
    local_620 = 1;
    x_10._M_len = local_20;
    x_10._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_10);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff550,in_stack_fffffffffffff54c);
    in_stack_fffffffffffff5b8 = &local_661;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_660,"",in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5b0 =
         ParameterCollection::add_parameters
                   ((ParameterCollection *)in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                    (ParameterInit *)init,in_RDI,device);
    local_5f0 = in_stack_fffffffffffff5b0.p;
    std::__cxx11::string::~string(local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0xdc1642);
    in_stack_fffffffffffff5a8 = (ParameterCollection *)(in_RDI + 0x30);
    local_6b0 = local_18;
    local_6ac = local_30;
    local_6a8 = &local_6b0;
    local_6a0 = 2;
    x_11._M_len = local_20;
    x_11._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_11);
    in_stack_fffffffffffff5a0 = &local_6d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6d0,"",in_stack_fffffffffffff5a0);
    in_stack_fffffffffffff598 =
         ParameterCollection::add_parameters
                   ((ParameterCollection *)in_stack_fffffffffffff5c8.p,in_stack_fffffffffffff5c0,
                    (float)((ulong)in_stack_fffffffffffff5b8 >> 0x20),in_stack_fffffffffffff5b0.p,
                    (Device *)in_stack_fffffffffffff5a8);
    local_670 = in_stack_fffffffffffff598.p;
    std::__cxx11::string::~string(local_6d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
    in_stack_fffffffffffff588 = (Device *)(in_RDI + 0x30);
    local_720 = local_18;
    local_71c = local_18;
    local_718 = &local_720;
    local_710 = 2;
    x_12._M_len = local_20;
    x_12._M_array = (iterator)this_02;
    in_stack_fffffffffffff594 = local_c;
    Dim::Dim(this_01,x_12);
    this_03 = &local_741;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_740,"",this_03);
    __a = ParameterCollection::add_lookup_parameters
                    (in_stack_fffffffffffff5a8,(uint)((ulong)in_stack_fffffffffffff5a0 >> 0x20),
                     (Dim *)in_stack_fffffffffffff598.p,
                     (string *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                     in_stack_fffffffffffff588);
    local_6e0 = __a.p;
    std::__cxx11::string::~string(local_740);
    std::allocator<char>::~allocator((allocator<char> *)&local_741);
    local_78c = local_18;
    local_788 = &local_78c;
    local_780 = 1;
    x_13._M_len = local_20;
    x_13._M_array = (iterator)this_02;
    Dim::Dim(this_01,x_13);
    ParameterInitConst::ParameterInitConst
              ((ParameterInitConst *)in_stack_fffffffffffff550,in_stack_fffffffffffff54c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7c0,"",&local_7c1);
    this_00 = ParameterCollection::add_parameters
                        ((ParameterCollection *)in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                         (ParameterInit *)init,in_RDI,device);
    local_750 = this_00.p;
    std::__cxx11::string::~string(local_7c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
    ParameterInitConst::~ParameterInitConst((ParameterInitConst *)0xdc1922);
    local_30 = local_18;
    local_831._1_8_ = local_100;
    local_831._9_8_ = local_250;
    local_831._17_8_ = local_2d0;
    local_818 = local_420;
    local_810 = local_4a0;
    local_808 = local_5f0;
    local_800 = local_670;
    local_7f8 = local_750;
    local_7f0 = local_831 + 1;
    local_7e8 = 8;
    __x = (value_type *)local_831;
    std::allocator<dynet::Parameter>::allocator((allocator<dynet::Parameter> *)0xdc19de);
    __l._M_len._0_4_ = in_stack_fffffffffffff590;
    __l._M_array = (iterator)in_stack_fffffffffffff588;
    __l._M_len._4_4_ = in_stack_fffffffffffff594;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)this_03,__l,
               (allocator_type *)__a.p);
    std::allocator<dynet::Parameter>::~allocator((allocator<dynet::Parameter> *)0xdc1a0f);
    in_stack_fffffffffffff550 = (ParameterCollection *)&stack0xfffffffffffff767;
    in_stack_fffffffffffff768 = local_170;
    std::allocator<dynet::LookupParameter>::allocator((allocator<dynet::LookupParameter> *)0xdc1aad)
    ;
    __l_00._M_len._0_4_ = in_stack_fffffffffffff590;
    __l_00._M_array = (iterator)in_stack_fffffffffffff588;
    __l_00._M_len._4_4_ = in_stack_fffffffffffff594;
    std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>::vector
              ((vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_> *)this_03,
               __l_00,(allocator_type *)__a.p);
    std::allocator<dynet::LookupParameter>::~allocator
              ((allocator<dynet::LookupParameter> *)0xdc1ade);
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                 *)this_00.p,(value_type *)__x);
    std::
    vector<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
    ::push_back((vector<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
                 *)this_00.p,__x);
    std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>::~vector
              ((vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_> *)this_00.p)
    ;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~vector
              ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)this_00.p);
  }
  return;
}

Assistant:

NaryTreeLSTMBuilder::NaryTreeLSTMBuilder(unsigned N,
                         unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         ParameterCollection& model) : layers(layers), N(N), cg(nullptr) {
  unsigned layer_input_dim = input_dim;
  local_model = model.add_subcollection("nary-tree-lstm-builder");
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameter p_x2i = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2i = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    LookupParameter p_c2i = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    Parameter p_bi = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // f
    Parameter p_x2f = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2f = local_model.add_lookup_parameters(N*N, {hidden_dim, hidden_dim});
    LookupParameter p_c2f = local_model.add_lookup_parameters(N*N, {hidden_dim, hidden_dim});
    Parameter p_bf = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // o
    Parameter p_x2o = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2o = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    LookupParameter p_c2o = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    Parameter p_bo = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // c (a.k.a. u)
    Parameter p_x2c = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2c = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    Parameter p_bc = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2i, p_bi, p_x2f, p_bf, p_x2o, p_bo, p_x2c, p_bc};
    vector<LookupParameter> lps = {p_h2i, p_h2f, p_h2o, p_h2c, p_c2i, p_c2f, p_c2o};
    params.push_back(ps);
    lparams.push_back(lps);
  }  // layers
}